

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidgetitemiterator.cpp
# Opt level: O3

void __thiscall
QTreeWidgetItemIteratorPrivate::ensureValidIterator
          (QTreeWidgetItemIteratorPrivate *this,QTreeWidgetItem *itemToBeRemoved)

{
  long *plVar1;
  QTreeWidgetItemIterator *this_00;
  long lVar2;
  QTreeWidget *this_01;
  bool bVar3;
  QTreeWidgetItem *pQVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  QTreeWidgetItemIteratorPrivate *this_02;
  QTreeWidgetItem *item;
  long in_FS_OFFSET;
  QTreeWidgetItemIterator local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->q_ptr;
  item = this_00->current;
  if (item != (QTreeWidgetItem *)0x0) {
    pQVar4 = item;
    if (item->par != itemToBeRemoved->par) {
      do {
        item = pQVar4;
        if (item == itemToBeRemoved) break;
        pQVar4 = item->par;
      } while (item->par != (QTreeWidgetItem *)0x0);
    }
    if (item == itemToBeRemoved) {
      this_02 = this;
      if (itemToBeRemoved != (QTreeWidgetItem *)0x0) {
        do {
          pQVar4 = nextSibling(this_02,item);
          item = item->par;
          if (item == (QTreeWidgetItem *)0x0) break;
        } while (pQVar4 == (QTreeWidgetItem *)0x0);
        if (pQVar4 != (QTreeWidgetItem *)0x0) {
          QTreeWidgetItemIterator::QTreeWidgetItemIterator
                    (&local_50,pQVar4,
                     (IteratorFlags)
                     (this_00->flags).
                     super_QFlagsStorageHelper<QTreeWidgetItemIterator::IteratorFlag,_4>.
                     super_QFlagsStorage<QTreeWidgetItemIterator::IteratorFlag>.i);
          QTreeWidgetItemIterator::operator=(this_00,&local_50);
          QTreeWidgetItemIterator::~QTreeWidgetItemIterator(&local_50);
          bVar3 = QTreeWidgetItemIterator::matchesFlags(this_00,pQVar4);
          item = pQVar4;
          if (!bVar3) {
            QTreeWidgetItemIterator::operator++(this_00);
          }
          goto LAB_005bb112;
        }
      }
      this_00->current = (QTreeWidgetItem *)0x0;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QList<int>::clear(&(this->m_parentIndex).super_QList<int>);
        return;
      }
      goto LAB_005bb29e;
    }
LAB_005bb112:
    pQVar4 = itemToBeRemoved->par;
    if (item->par == pQVar4) {
      if (item->par == (QTreeWidgetItem *)0x0) {
        this_01 = itemToBeRemoved->view;
        iVar8 = QTreeWidget::indexOfTopLevelItem(this_01,itemToBeRemoved);
        iVar6 = QTreeWidget::indexOfTopLevelItem(this_01,item);
      }
      else {
        QTreeWidgetItem::executePendingSort(pQVar4);
        lVar2 = (pQVar4->children).d.size;
        iVar8 = -1;
        if (lVar2 != 0) {
          lVar7 = 0;
          do {
            if (lVar2 << 3 == lVar7) {
              iVar8 = -1;
              break;
            }
            iVar8 = iVar8 + 1;
            plVar1 = (long *)((long)(pQVar4->children).d.ptr + lVar7);
            lVar7 = lVar7 + 8;
          } while ((QTreeWidgetItem *)*plVar1 != itemToBeRemoved);
        }
        QTreeWidgetItem::executePendingSort(pQVar4);
        lVar2 = (pQVar4->children).d.size;
        iVar6 = -1;
        if (lVar2 != 0) {
          lVar7 = 0;
          iVar5 = -1;
          do {
            iVar6 = -1;
            if (lVar2 << 3 == lVar7) break;
            iVar6 = iVar5 + 1;
            plVar1 = (long *)((long)(pQVar4->children).d.ptr + lVar7);
            lVar7 = lVar7 + 8;
            iVar5 = iVar6;
          } while ((QTreeWidgetItem *)*plVar1 != item);
        }
      }
      if (iVar8 <= iVar6) {
        this->m_currentIndex = this->m_currentIndex + -1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005bb29e:
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetItemIteratorPrivate::ensureValidIterator(const QTreeWidgetItem *itemToBeRemoved)
{
    Q_Q(QTreeWidgetItemIterator);
    Q_ASSERT(itemToBeRemoved);

    if (!q->current) return;
    QTreeWidgetItem *nextItem = q->current;

    // Do not walk to the ancestor to find the other item if they have the same parent.
    if (nextItem->parent() != itemToBeRemoved->parent()) {
        while (nextItem->parent() && nextItem != itemToBeRemoved) {
            nextItem = nextItem->parent();
        }
    }
    // If the item to be removed is an ancestor of the current iterator item,
    // we need to adjust the iterator.
    if (nextItem == itemToBeRemoved) {
        QTreeWidgetItem *parent = nextItem;
        nextItem = nullptr;
        while (parent && !nextItem) {
            nextItem = nextSibling(parent);
            parent = parent->parent();
        }
        if (nextItem) {
            // Ooooh... Set the iterator to the next valid item
            *q = QTreeWidgetItemIterator(nextItem, q->flags);
            if (!(q->matchesFlags(nextItem))) ++(*q);
        } else {
            // set it to null.
            q->current = nullptr;
            m_parentIndex.clear();
            return;
        }
    }
    if (nextItem->parent() == itemToBeRemoved->parent()) {
        // They have the same parent, i.e. we have to adjust the m_currentIndex member of the iterator
        // if the deleted item is to the left of the nextItem.

        QTreeWidgetItem *par = itemToBeRemoved->parent();   // We know they both have the same parent.
        QTreeWidget *tw = itemToBeRemoved->treeWidget();    // ..and widget
        int indexOfItemToBeRemoved = par ? par->indexOfChild(const_cast<QTreeWidgetItem *>(itemToBeRemoved))
            : tw->indexOfTopLevelItem(const_cast<QTreeWidgetItem *>(itemToBeRemoved));
        int indexOfNextItem = par ? par->indexOfChild(nextItem) : tw->indexOfTopLevelItem(nextItem);

        if (indexOfItemToBeRemoved <= indexOfNextItem) {
            // A sibling to the left of us was deleted, adjust the m_currentIndex member of the iterator.
            // Note that the m_currentIndex will be wrong until the item is actually removed!
            m_currentIndex--;
        }
    }
}